

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void CVmObjGramProd::process_work_queue
               (CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,CVmGramProdQueue *queues,
               CVmObjDict *dict)

{
  long lVar1;
  bool bVar2;
  long *in_RCX;
  CVmGramProdState *nxt;
  CVmGramProdState *prv;
  CVmGramProdState *cur;
  int min_badness;
  int first;
  CVmObjDict *in_stack_00000058;
  CVmGramProdQueue *in_stack_00000060;
  size_t in_stack_00000068;
  vmgramprod_tok *in_stack_00000070;
  CVmGramProdMem *in_stack_00000078;
  long local_40;
  long local_38;
  int local_30;
  
  while( true ) {
    if ((*in_RCX == 0) && (in_RCX[2] == 0)) {
      bVar2 = true;
      local_30 = 0;
      for (local_38 = in_RCX[1]; local_38 != 0; local_38 = *(long *)(local_38 + 0x30)) {
        if ((bVar2) || (*(int *)(*(long *)(local_38 + 0x20) + 4) < local_30)) {
          local_30 = *(int *)(*(long *)(local_38 + 0x20) + 4);
        }
        bVar2 = false;
      }
      local_40 = 0;
      local_38 = in_RCX[1];
      while (local_38 != 0) {
        lVar1 = *(long *)(local_38 + 0x30);
        if (*(int *)(*(long *)(local_38 + 0x20) + 4) == local_30) {
          if (local_40 == 0) {
            in_RCX[1] = *(long *)(local_38 + 0x30);
          }
          else {
            *(undefined8 *)(local_40 + 0x30) = *(undefined8 *)(local_38 + 0x30);
          }
          *(long *)(local_38 + 0x30) = *in_RCX;
          *in_RCX = local_38;
          local_38 = lVar1;
        }
        else {
          local_40 = local_38;
          local_38 = lVar1;
        }
      }
    }
    if (*in_RCX == 0) break;
    process_work_queue_head
              (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
               in_stack_00000058);
  }
  return;
}

Assistant:

void CVmObjGramProd::process_work_queue(VMG_ CVmGramProdMem *mem,
                                        const vmgramprod_tok *tok,
                                        size_t tok_cnt,
                                        CVmGramProdQueue *queues,
                                        CVmObjDict *dict)
{
    /* keep going until the work queue and badness queue are empty */
    for (;;)
    {
        /* 
         *   If the work queue is empty, fall back on the badness queue.
         *   Ignore the badness queue if we have any successful matches,
         *   since non-badness matches always take precedence over badness
         *   items. 
         */
        if (queues->work_queue_ == 0 && queues->success_list_ == 0)
        {
            int first;
            int min_badness;
            CVmGramProdState *cur;
            CVmGramProdState *prv;
            CVmGramProdState *nxt;
            
            /* find the lowest badness rating in the queue */
            for (first = TRUE, min_badness = 0, cur = queues->badness_queue_ ;
                 cur != 0 ; cur = cur->nxt_, first = FALSE)
            {
                /* 
                 *   if we're on the first item, note its badness as the
                 *   tentative minimum; otherwise, note the current item's
                 *   badness if it's lower than the lowest we've seen so
                 *   far 
                 */
                if (first || cur->altp_->badness < min_badness)
                    min_badness = cur->altp_->badness;
            }

            /* 
             *   move each of the items whose badness matches the minimum
             *   badness out of the badness queue and into the work queue 
             */
            for (cur = queues->badness_queue_, prv = 0 ; cur != 0 ;
                 cur = nxt)
            {
                /* remember the next item, in case we remove this one */
                nxt = cur->nxt_;
                
                /* if this item has minimum badness, move it */
                if (cur->altp_->badness == min_badness)
                {
                    /* unlink it from the badness queue */
                    if (prv == 0)
                        queues->badness_queue_ = cur->nxt_;
                    else
                        prv->nxt_ = cur->nxt_;

                    /* link it into the work queue */
                    cur->nxt_ = queues->work_queue_;
                    queues->work_queue_ = cur;
                }
                else
                {
                    /* 
                     *   this item is staying in the list - note it as the
                     *   item preceding the next item 
                     */
                    prv = cur;
                }
            }
        }

        /* if the work queue is still empty, we're out of work to do */
        if (queues->work_queue_ == 0)
            break;
        
        /* process the head of the work queue */
        process_work_queue_head(vmg_ mem, tok, tok_cnt, queues, dict);
    }
}